

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O1

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
::destroyAll(DenseMapBase<llvm::DenseMap<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             *this)

{
  uint uVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  
  uVar1 = *(uint *)(this + 0x10);
  if ((ulong)uVar1 != 0) {
    lVar2 = *(long *)this;
    lVar4 = 0;
    do {
      if ((*(ulong *)(lVar2 + lVar4) < 0xfffffffffffffffe) &&
         (pvVar3 = *(void **)(lVar2 + 8 + lVar4), pvVar3 != (void *)0x0)) {
        operator_delete(pvVar3,*(long *)(lVar2 + 0x18 + lVar4) - (long)pvVar3);
      }
      lVar4 = lVar4 + 0x20;
    } while ((ulong)uVar1 << 5 != lVar4);
  }
  return;
}

Assistant:

unsigned getNumBuckets() const {
    return NumBuckets;
  }